

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_point_read_binary
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *pt,uchar *buf,size_t ilen)

{
  int iVar1;
  size_t buflen;
  
  iVar1 = -0x4f80;
  if (ilen != 0) {
    buflen = mbedtls_mpi_size(&grp->P);
    if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
      iVar1 = -0x4e80;
    }
    else if (((grp->G).Y.p != (mbedtls_mpi_uint *)0x0) ||
            ((((buflen == ilen && (iVar1 = mbedtls_mpi_read_binary_le(&pt->X,buf,ilen), iVar1 == 0))
              && ((mbedtls_mpi_free(&pt->Y), grp->id != MBEDTLS_ECP_DP_CURVE25519 ||
                  (iVar1 = mbedtls_mpi_set_bit(&pt->X,ilen * 8 - 1,'\0'), iVar1 == 0)))) &&
             (((iVar1 = mbedtls_mpi_lset(&pt->Z,1), iVar1 == 0 &&
               (iVar1 = 0, (grp->G).X.p != (mbedtls_mpi_uint *)0x0)) &&
              ((grp->G).Y.p != (mbedtls_mpi_uint *)0x0)))))) {
      if (*buf == '\x04') {
        iVar1 = -0x4f80;
        if (buflen * 2 + 1 == ilen) {
          iVar1 = mbedtls_mpi_read_binary(&pt->X,buf + 1,buflen);
          if ((iVar1 == 0) &&
             (iVar1 = mbedtls_mpi_read_binary(&pt->Y,buf + 1 + buflen,buflen), iVar1 == 0)) {
            iVar1 = mbedtls_mpi_lset(&pt->Z,1);
            return iVar1;
          }
        }
      }
      else {
        iVar1 = -0x4e80;
        if ((*buf == '\0') && (iVar1 = -0x4f80, ilen == 1)) {
          iVar1 = mbedtls_ecp_set_zero(pt);
          return iVar1;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecp_point_read_binary( const mbedtls_ecp_group *grp,
                                   mbedtls_ecp_point *pt,
                                   const unsigned char *buf, size_t ilen )
{
    int ret = MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
    size_t plen;
    ECP_VALIDATE_RET( grp != NULL );
    ECP_VALIDATE_RET( pt  != NULL );
    ECP_VALIDATE_RET( buf != NULL );

    if( ilen < 1 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    plen = mbedtls_mpi_size( &grp->P );

#if defined(ECP_MONTGOMERY)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_MONTGOMERY )
    {
        if( plen != ilen )
            return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

        MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary_le( &pt->X, buf, plen ) );
        mbedtls_mpi_free( &pt->Y );

        if( grp->id == MBEDTLS_ECP_DP_CURVE25519 )
            /* Set most significant bit to 0 as prescribed in RFC7748 §5 */
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( &pt->X, plen * 8 - 1, 0 ) );

        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &pt->Z, 1 ) );
    }
#endif
#if defined(ECP_SHORTWEIERSTRASS)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS )
    {
        if( buf[0] == 0x00 )
        {
            if( ilen == 1 )
                return( mbedtls_ecp_set_zero( pt ) );
            else
                return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
        }

        if( buf[0] != 0x04 )
            return( MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE );

        if( ilen != 2 * plen + 1 )
            return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

        MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &pt->X, buf + 1, plen ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &pt->Y,
                                                  buf + 1 + plen, plen ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &pt->Z, 1 ) );
    }
#endif

cleanup:
    return( ret );
}